

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void sha1_finalise(sha1_ctx *ctx,uint8_t *digest)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uchar c;
  uchar finalcount [8];
  uint8_t local_29;
  uint8_t local_28 [8];
  
  bVar1 = 0;
  uVar2 = 0;
  do {
    local_28[uVar2] = (uint8_t)(ctx->count[uVar2 < 4] >> (~bVar1 & 0x18));
    uVar2 = uVar2 + 1;
    bVar1 = bVar1 + 8;
  } while (uVar2 != 8);
  local_29 = 0x80;
  sha1_update(ctx,&local_29,1);
  if ((ctx->count[0] & 0x1f8) != 0x1c0) {
    do {
      local_29 = '\0';
      sha1_update(ctx,&local_29,1);
    } while ((ctx->count[0] & 0x1f8) != 0x1c0);
  }
  sha1_update(ctx,local_28,8);
  bVar1 = 0;
  lVar3 = 0;
  do {
    digest[lVar3] =
         (uint8_t)(*(uint *)((long)ctx->state + (ulong)((uint)lVar3 & 0xfffffffc)) >>
                  (~bVar1 & 0x18));
    lVar3 = lVar3 + 1;
    bVar1 = bVar1 + 8;
  } while (lVar3 != 0x14);
  return;
}

Assistant:

void sha1_finalise(struct sha1_ctx *ctx, uint8_t digest[20]) {
  unsigned i;
  unsigned char finalcount[8];
  unsigned char c;

  for (i = 0; i < 8; i++) {
    finalcount[i] =
        (unsigned char)((ctx->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8)) &
                        255);
  }
  c = 0200;
  sha1_update(ctx, &c, 1);
  while ((ctx->count[0] & 504) != 448) {
    c = 0000;
    sha1_update(ctx, &c, 1);
  }
  sha1_update(ctx, finalcount, 8);
  for (i = 0; i < 20; i++) {
    digest[i] =
        (unsigned char)((ctx->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
  }
}